

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# link.c
# Opt level: O1

int send_attach(LINK_INSTANCE *link,char *name,handle handle,role role)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  ATTACH_HANDLE attach;
  LOGGER_LOG p_Var4;
  role role_value;
  char *pcVar5;
  
  role_value = SUB41(handle,0);
  attach = attach_create(name,0,role_value);
  if (attach == (ATTACH_HANDLE)0x0) {
    p_Var4 = xlogging_get_log_function();
    if (p_Var4 == (LOGGER_LOG)0x0) {
      return 0x10a;
    }
    (*p_Var4)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/link.c"
              ,"send_attach",0x109,1,"NULL attach performative");
    return 0x10a;
  }
  link->delivery_count = link->initial_delivery_count;
  attach_set_snd_settle_mode(attach,link->snd_settle_mode);
  attach_set_rcv_settle_mode(attach,link->rcv_settle_mode);
  attach_set_role(attach,role_value);
  attach_set_source(attach,link->source);
  attach_set_target(attach,link->target);
  if (link->attach_properties != (fields)0x0) {
    attach_set_properties(attach,link->attach_properties);
  }
  bVar1 = true;
  iVar3 = 0;
  if ((role_value == false) &&
     (iVar2 = attach_set_initial_delivery_count(attach,link->delivery_count), iVar3 = 0, iVar2 != 0)
     ) {
    p_Var4 = xlogging_get_log_function();
    iVar3 = 0x121;
    if (p_Var4 == (LOGGER_LOG)0x0) {
      bVar1 = false;
    }
    else {
      bVar1 = false;
      (*p_Var4)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/link.c"
                ,"send_attach",0x120,1,"Cannot set attach initial delivery count");
    }
  }
  if (!bVar1) goto LAB_0016b412;
  iVar3 = attach_set_max_message_size(attach,link->max_message_size);
  if (iVar3 == 0) {
    iVar3 = session_send_attach(link->link_endpoint,attach);
    if (iVar3 == 0) {
      iVar3 = 0;
      goto LAB_0016b412;
    }
    p_Var4 = xlogging_get_log_function();
    iVar3 = 0x12f;
    if (p_Var4 == (LOGGER_LOG)0x0) goto LAB_0016b412;
    pcVar5 = "Sending attach failed in session send";
    iVar2 = 0x12e;
  }
  else {
    p_Var4 = xlogging_get_log_function();
    iVar3 = 0x12a;
    if (p_Var4 == (LOGGER_LOG)0x0) goto LAB_0016b412;
    pcVar5 = "Cannot set max message size";
    iVar2 = 0x129;
  }
  (*p_Var4)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/link.c"
            ,"send_attach",iVar2,1,pcVar5);
LAB_0016b412:
  attach_destroy(attach);
  return iVar3;
}

Assistant:

static int send_attach(LINK_INSTANCE* link, const char* name, handle handle, role role)
{
    int result;
    ATTACH_HANDLE attach = attach_create(name, handle, role);

    if (attach == NULL)
    {
        LogError("NULL attach performative");
        result = MU_FAILURE;
    }
    else
    {
        result = 0;

        link->delivery_count = link->initial_delivery_count;

        attach_set_snd_settle_mode(attach, link->snd_settle_mode);
        attach_set_rcv_settle_mode(attach, link->rcv_settle_mode);
        attach_set_role(attach, role);
        attach_set_source(attach, link->source);
        attach_set_target(attach, link->target);
        if (link->attach_properties != NULL)
        {
            (void)attach_set_properties(attach, link->attach_properties);
        }

        if (role == role_sender)
        {
            if (attach_set_initial_delivery_count(attach, link->delivery_count) != 0)
            {
                LogError("Cannot set attach initial delivery count");
                result = MU_FAILURE;
            }
        }

        if (result == 0)
        {
            if (attach_set_max_message_size(attach, link->max_message_size) != 0)
            {
                LogError("Cannot set max message size");
                result = MU_FAILURE;
            }
            else if (session_send_attach(link->link_endpoint, attach) != 0)
            {
                LogError("Sending attach failed in session send");
                result = MU_FAILURE;
            }
            else
            {
                result = 0;
            }
        }

        attach_destroy(attach);
    }

    return result;
}